

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void aom_get_var_sse_sum_16x16_dual_avx2
               (uint8_t *src_ptr,int source_stride,uint8_t *ref_ptr,int ref_stride,
               uint32_t *sse16x16,uint *tot_sse,int *tot_sum,uint32_t *var16x16)

{
  uint32_t *in_R9;
  uint *in_stack_00000008;
  int *in_stack_00000010;
  uint32_t *in_stack_00000108;
  int in_stack_00000110;
  int in_stack_00000114;
  uint8_t *in_stack_00000118;
  int in_stack_00000124;
  uint8_t *in_stack_00000128;
  
  get_var_sse_sum_16x16_dual_avx2
            (in_stack_00000128,in_stack_00000124,in_stack_00000118,in_stack_00000114,
             in_stack_00000110,in_stack_00000108,in_stack_00000008,in_stack_00000010,in_R9);
  return;
}

Assistant:

void aom_get_var_sse_sum_16x16_dual_avx2(const uint8_t *src_ptr,
                                         int source_stride,
                                         const uint8_t *ref_ptr, int ref_stride,
                                         uint32_t *sse16x16,
                                         unsigned int *tot_sse, int *tot_sum,
                                         uint32_t *var16x16) {
  get_var_sse_sum_16x16_dual_avx2(src_ptr, source_stride, ref_ptr, ref_stride,
                                  16, sse16x16, tot_sse, tot_sum, var16x16);
}